

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O3

void ht_listener_buffer_process_unserialized_events
               (HT_ListenerBuffer *buffer,TEventPtr events,size_t size,
               HT_ListenerFlushCallback flush_callback,void *listener)

{
  long *plVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (buffer->max_size != 0) {
    if (size != 0) {
      uVar4 = 0;
      do {
        plVar1 = (long *)(events + uVar4);
        lVar2 = (**(code **)(*(long *)(events + uVar4) + 0x10))(plVar1);
        sVar3 = buffer->usage;
        if (buffer->max_size < lVar2 + sVar3) {
          (*flush_callback)(listener,buffer->data,sVar3);
          buffer->usage = 0;
          sVar3 = 0;
        }
        lVar2 = (**(code **)(*plVar1 + 8))(plVar1,buffer->data + sVar3);
        buffer->usage = buffer->usage + lVar2;
        uVar4 = uVar4 + *(long *)(*(long *)*plVar1 + 0x10);
      } while (uVar4 < size);
    }
    return;
  }
  __assert_fail("!HT_IS_BYPASS_MODE(buffer)",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O3/hawktracer.cpp"
                ,0xaf7,
                "void ht_listener_buffer_process_unserialized_events(HT_ListenerBuffer *, TEventPtr, size_t, HT_ListenerFlushCallback, void *)"
               );
}

Assistant:

void
ht_listener_buffer_process_unserialized_events(HT_ListenerBuffer* buffer,
                                               TEventPtr events,
                                               size_t size,
                                               HT_ListenerFlushCallback flush_callback,
                                               void* listener)
{
    size_t i;

    assert(!HT_IS_BYPASS_MODE(buffer));

    for (i = 0; i < size;)
    {
        HT_Event* event = HT_EVENT(events + i);

        if (HT_EVENT_GET_KLASS(event)->get_size(event) + buffer->usage > buffer->max_size)
        {
            ht_listener_buffer_flush(buffer, flush_callback, listener);
        }

        buffer->usage += HT_EVENT_GET_KLASS(event)->serialize(event, buffer->data + buffer->usage);
        i += HT_EVENT_GET_KLASS(event)->type_info->size;
    }
}